

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-pta-dump.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  _Head_base<0UL,_llvm::Module_*,_false> m;
  undefined8 uVar1;
  __uniq_ptr_impl<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_> this;
  char cVar2;
  int iVar3;
  Function *pFVar4;
  DGLLVMPointerAnalysis *this_00;
  raw_ostream *prVar5;
  __normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
  _Var6;
  ulong *puVar7;
  long lVar8;
  ostream *poVar9;
  undefined4 extraout_var;
  Module *pMVar10;
  ulong *puVar11;
  Value *val;
  ulong uVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *func;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  ulong *puVar14;
  bool bVar15;
  StringRef SVar16;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> M;
  const_iterator __begin5;
  Function *llvmFunc;
  const_iterator __end5;
  LLVMContext context;
  DGLLVMPointerAnalysis PTA;
  TimeMeasure tm;
  SlicerOptions options;
  _Head_base<0UL,_llvm::Module_*,_false> local_498;
  const_iterator local_490;
  DGLLVMPointerAnalysis *local_488;
  undefined1 local_480 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_470;
  Module *local_460;
  Module *local_458;
  ulong *local_450;
  ulong *local_448;
  ulong *local_440;
  const_iterator local_438;
  undefined1 local_430 [8];
  undefined1 local_428 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418 [7];
  __uniq_ptr_impl<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>
  local_3a8;
  unique_ptr<dg::pta::LLVMPointerGraphBuilder,_std::default_delete<dg::pta::LLVMPointerGraphBuilder>_>
  local_3a0;
  TimeMeasure local_398;
  undefined1 local_380 [96];
  pointer pcStack_320;
  PTType local_318;
  bool local_314;
  undefined1 local_310 [96];
  pointer pcStack_2b0;
  undefined1 local_2a8 [16];
  long local_298;
  type local_280;
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  local_278;
  undefined8 local_248;
  _Alloc_hider _Stack_240;
  PTType local_238;
  char local_234;
  
  setupStackTraceOnError(argc,argv);
  parseSlicerOptions((int)local_2a8 + 8,(char **)(ulong)(uint)argc,SUB81(argv,0),false);
  if (verbose_more[0x80] == '\x01') {
    local_428[0] = 1;
    verbose[0x80] = 1;
    if (verbose._176_8_ == 0) goto LAB_00111846;
    (*(code *)verbose._184_8_)(0x123450,local_428);
  }
  if (callgraph_only[0x80] == '\x01') {
    local_428[0] = 1;
    callgraph[0x80] = 1;
    if (callgraph._176_8_ == 0) {
LAB_00111846:
      std::__throw_bad_function_call();
    }
    (*(code *)callgraph._184_8_)(0x123810,local_428);
  }
  llvm::LLVMContext::LLVMContext((LLVMContext *)local_430);
  parseModule((char *)&local_498,(LLVMContext *)"llvm-pta-dump",(SlicerOptions *)local_430);
  if (local_498._M_head_impl == (Module *)0x0) {
    iVar3 = 1;
    goto LAB_00111813;
  }
  if (display_only_abi_cxx11_._136_8_ != 0) {
    splitList((string *)local_428,'8');
    uVar1 = local_428._8_8_;
    bVar15 = local_428._0_8_ == local_428._8_8_;
    if (bVar15) {
      iVar3 = 0;
    }
    else {
      iVar3 = 0;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_428._0_8_;
      do {
        SVar16.Length = paVar13->_M_allocated_capacity;
        SVar16.Data = (char *)local_498._M_head_impl;
        pFVar4 = (Function *)llvm::Module::getFunction(SVar16);
        local_480._0_8_ = pFVar4;
        if (pFVar4 == (Function *)0x0) {
          prVar5 = (raw_ostream *)llvm::errs();
          Str.Length = 0x1d;
          Str.Data = "Invalid function to display: ";
          prVar5 = llvm::raw_ostream::operator<<(prVar5,Str);
          prVar5 = (raw_ostream *)
                   llvm::raw_ostream::write((char *)prVar5,paVar13->_M_allocated_capacity);
          Str_00.Length = 0x23;
          Str_00.Data = ". Function not found in the module\n";
          llvm::raw_ostream::operator<<(prVar5,Str_00);
          iVar3 = 1;
        }
        else if (display_only_func.
                 super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish ==
                 display_only_func.
                 super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<llvm::Function_const*,std::allocator<llvm::Function_const*>>::
          _M_realloc_insert<llvm::Function_const*const&>
                    ((vector<llvm::Function_const*,std::allocator<llvm::Function_const*>> *)
                     &display_only_func,
                     (iterator)
                     display_only_func.
                     super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(Function **)local_480);
        }
        else {
          *display_only_func.
           super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
           _M_impl.super__Vector_impl_data._M_finish = pFVar4;
          display_only_func.
          super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               display_only_func.
               super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        if (pFVar4 == (Function *)0x0) break;
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar13->_M_local_buf + 0x20);
        bVar15 = paVar13 ==
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)uVar1;
      } while (!bVar15);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_428);
    if (!bVar15) goto LAB_00111813;
  }
  local_398.s.__d.__r = (duration)0;
  local_398.e.__d.__r = (duration)0;
  if (dump_ir[0x80] == '\0') {
    this_00 = (DGLLVMPointerAnalysis *)operator_new(0x90);
    m._M_head_impl = local_498._M_head_impl;
    local_310._0_8_ = local_310 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_310,local_2a8._8_8_,local_298 + local_2a8._8_8_);
    local_310._32_8_ = local_280;
    std::
    _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
    ::_Rb_tree((_Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
                *)(local_310 + 0x28),&local_278);
    local_310._88_8_ = local_248;
    pcStack_2b0 = _Stack_240._M_p;
    local_2a8._0_4_ = local_238;
    local_2a8[4] = local_234;
    local_488 = this_00;
    dg::DGLLVMPointerAnalysis::DGLLVMPointerAnalysis
              (this_00,m._M_head_impl,(LLVMPointerAnalysisOptions *)local_310);
    std::
    _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
    ::_M_erase((_Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
                *)(local_310 + 0x28),(_Link_type)local_310._56_8_);
    if ((undefined1 *)local_310._0_8_ != local_310 + 0x10) {
      operator_delete((void *)local_310._0_8_,local_310._16_8_ + 1);
    }
    local_398.s.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    (*(local_488->super_LLVMPointerAnalysis)._vptr_LLVMPointerAnalysis[3])();
    local_398.e.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    local_428._0_8_ = local_418;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_428,"INFO: Pointer analysis took","");
    dg::debug::TimeMeasure::report(&local_398,(string *)local_428,(ostream *)&std::cerr);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._0_8_ != local_418) {
      operator_delete((void *)local_428._0_8_,(ulong)(local_418[0]._0_8_ + 1));
    }
    if (_stats[0x80] == '\x01') {
      if (local_238 == svf) {
        prVar5 = (raw_ostream *)llvm::errs();
        Str_01.Length = 0x2c;
        Str_01.Data = "SVF analysis does not support stats dumping\n";
        llvm::raw_ostream::operator<<(prVar5,Str_01);
      }
      else {
        dumpStats(local_488);
      }
    }
    else if (_quiet[0x80] == '\0') {
      if (dump_c_lines[0x80] == '\x01') {
        allocasToVars((Module *)local_428);
        std::
        map<const_llvm::Value_*,_CVariableDecl,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_CVariableDecl>_>_>
        ::operator=(&valuesToVars,
                    (map<const_llvm::Value_*,_CVariableDecl,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_CVariableDecl>_>_>
                     *)local_428);
        std::
        _Rb_tree<const_llvm::Value_*,_std::pair<const_llvm::Value_*const,_CVariableDecl>,_std::_Select1st<std::pair<const_llvm::Value_*const,_CVariableDecl>_>,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_CVariableDecl>_>_>
        ::_M_erase((_Rb_tree<const_llvm::Value_*,_std::pair<const_llvm::Value_*const,_CVariableDecl>,_std::_Select1st<std::pair<const_llvm::Value_*const,_CVariableDecl>_>,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_CVariableDecl>_>_>
                    *)local_428,(_Link_type)local_418[0]._0_8_);
        if (valuesToVars._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
          prVar5 = (raw_ostream *)llvm::errs();
          Str_02.Length = 0x29;
          Str_02.Data = "WARNING: No debugging information found, ";
          prVar5 = llvm::raw_ostream::operator<<(prVar5,Str_02);
          Str_03.Length = 0x25;
          Str_03.Data = "the C lines output will be corrupted\n";
          llvm::raw_ostream::operator<<(prVar5,Str_03);
        }
      }
      pMVar10 = *(Module **)(local_498._M_head_impl + 0x20);
      local_460 = local_498._M_head_impl + 0x18;
      if (pMVar10 != local_460) {
        do {
          paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pMVar10 + -0x38);
          if (pMVar10 == (Module *)0x0) {
            paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
          }
          local_458 = pMVar10;
          if ((display_only_func.
               super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
               _M_impl.super__Vector_impl_data._M_start ==
               display_only_func.
               super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
               _M_impl.super__Vector_impl_data._M_finish) ||
             (local_428._0_8_ = paVar13,
             _Var6 = std::
                     __find_if<__gnu_cxx::__normal_iterator<llvm::Function_const**,std::vector<llvm::Function_const*,std::allocator<llvm::Function_const*>>>,__gnu_cxx::__ops::_Iter_equals_val<llvm::Function*const>>
                               (display_only_func.
                                super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                display_only_func.
                                super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish,local_428),
             _Var6._M_current !=
             display_only_func.
             super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
             _M_impl.super__Vector_impl_data._M_finish)) {
            puVar7 = *(ulong **)(paVar13->_M_local_buf + 0x50);
            puVar11 = (ulong *)(paVar13->_M_local_buf + 0x48);
            if (puVar7 != (ulong *)(paVar13->_M_local_buf + 0x48)) {
              do {
                local_450 = puVar11;
                puVar11 = puVar7 + -3;
                if (puVar7 == (ulong *)0x0) {
                  puVar11 = (ulong *)0x0;
                }
                puVar14 = (ulong *)puVar11[6];
                puVar11 = puVar11 + 5;
                local_448 = puVar7;
                local_440 = puVar11;
                if (puVar14 != puVar11) {
                  do {
                    val = (Value *)(puVar14 + -3);
                    if (puVar14 == (ulong *)0x0) {
                      val = (Value *)0x0;
                    }
                    if (((*(byte *)(*(long *)val + 8) | 2) == 0xf) &&
                       ((dump_c_lines[0x80] != '\x01' || (val[0x10] != (Value)0x3a)))) {
                      (*(local_488->super_LLVMPointerAnalysis)._vptr_LLVMPointerAnalysis[1])
                                (local_480,local_488,val);
                      lVar8 = (**(code **)(*(long *)local_480._0_8_ + 0x20))();
                      if ((lVar8 != 1) ||
                         (cVar2 = (*(code *)**(undefined8 **)local_480._0_8_)(), cVar2 == '\0')) {
                        valToStr_abi_cxx11_((string *)local_428,val);
                        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                           ((ostream *)&std::cout,(char *)local_428._0_8_,
                                            local_428._8_8_);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_428._0_8_ != local_418) {
                          operator_delete((void *)local_428._0_8_,(ulong)(local_418[0]._0_8_ + 1));
                        }
                        pFVar4 = (Function *)local_480._0_8_;
                        if (((Function *)local_480._0_8_ != (Function *)0x0) &&
                           (cVar2 = (**(code **)(*(long *)local_480._0_8_ + 0x38))(local_480._0_8_),
                           cVar2 != '\0')) {
                          pFVar4 = (Function *)0x0;
                        }
                        local_438.impl = (LLVMPointsToSetImpl *)0x0;
                        local_490.impl = (LLVMPointsToSetImpl *)pFVar4;
                        while (bVar15 = dg::LLVMPointsToSet::const_iterator::operator==
                                                  (&local_490,&local_438), !bVar15) {
                          iVar3 = (*(local_490.impl)->_vptr_LLVMPointsToSetImpl[9])();
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,"  -> ",5);
                          valToStr_abi_cxx11_((string *)local_428,
                                              (Value *)CONCAT44(extraout_var,iVar3));
                          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                             ((ostream *)&std::cout,(char *)local_428._0_8_,
                                              local_428._8_8_);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_428._0_8_ != local_418) {
                            operator_delete((void *)local_428._0_8_,(ulong)(local_418[0]._0_8_ + 1))
                            ;
                          }
                          (*(local_490.impl)->_vptr_LLVMPointsToSetImpl[8])();
                          iVar3 = (*(local_490.impl)->_vptr_LLVMPointsToSetImpl[7])();
                          if ((char)iVar3 != '\0') {
                            local_490.impl = (LLVMPointsToSetImpl *)0x0;
                          }
                        }
                        cVar2 = (*(code *)**(undefined8 **)local_480._0_8_)();
                        if (cVar2 != '\0') {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,"  -> unknown\n",0xd);
                        }
                        cVar2 = (**(code **)(*(long *)local_480._0_8_ + 8))();
                        if (cVar2 != '\0') {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,"  -> null\n",10);
                        }
                        cVar2 = (**(code **)(*(long *)local_480._0_8_ + 0x10))();
                        if (cVar2 != '\0') {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,"  -> null + ?\n",0xe);
                        }
                        cVar2 = (**(code **)(*(long *)local_480._0_8_ + 0x18))();
                        if (cVar2 != '\0') {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,"  -> invalidated\n",0x11);
                        }
                      }
                      puVar11 = local_440;
                      if ((Function *)local_480._0_8_ != (Function *)0x0) {
                        (**(code **)(*(long *)local_480._0_8_ + 0x58))();
                        puVar11 = local_440;
                      }
                    }
                    puVar14 = (ulong *)puVar14[1];
                  } while (puVar14 != puVar11);
                }
                puVar7 = (ulong *)local_448[1];
                puVar11 = local_450;
              } while (puVar7 != local_450);
            }
          }
          pMVar10 = *(Module **)(local_458 + 8);
        } while (pMVar10 != local_460);
      }
    }
    (*(local_488->super_LLVMPointerAnalysis)._vptr_LLVMPointerAnalysis[5])();
  }
  else {
    local_380._0_8_ = local_380 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_380,local_2a8._8_8_,local_298 + local_2a8._8_8_);
    local_380._32_8_ = local_280;
    std::
    _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
    ::_Rb_tree((_Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
                *)(local_380 + 0x28),&local_278);
    local_380._88_8_ = local_248;
    pcStack_320 = _Stack_240._M_p;
    local_318 = local_238;
    local_314 = (bool)local_234;
    dg::DGLLVMPointerAnalysis::DGLLVMPointerAnalysis
              ((DGLLVMPointerAnalysis *)local_428,local_498._M_head_impl,
               (LLVMPointerAnalysisOptions *)local_380);
    std::
    _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
    ::_M_erase((_Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
                *)(local_380 + 0x28),(_Link_type)local_380._56_8_);
    if ((undefined1 *)local_380._0_8_ != local_380 + 0x10) {
      operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
    }
    local_398.s.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    dg::DGLLVMPointerAnalysis::initialize((DGLLVMPointerAnalysis *)local_428);
    this._M_t.
    super__Tuple_impl<0UL,_dg::pta::PointerAnalysis_*,_std::default_delete<dg::pta::PointerAnalysis>_>
    .super__Head_base<0UL,_dg::pta::PointerAnalysis_*,_false>._M_head_impl =
         local_3a8._M_t.
         super__Tuple_impl<0UL,_dg::pta::PointerAnalysis_*,_std::default_delete<dg::pta::PointerAnalysis>_>
         .super__Head_base<0UL,_dg::pta::PointerAnalysis_*,_false>._M_head_impl;
    if (dump_graph_only[0x80] == '\x01') {
      local_398.e.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      local_480._0_8_ = (Function *)(local_480 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_480,"INFO: Pointer analysis (building graph) took","");
      dg::debug::TimeMeasure::report(&local_398,(string *)local_480,(ostream *)&std::cerr);
      if ((Function *)local_480._0_8_ != (Function *)(local_480 + 0x10)) {
        operator_delete((void *)local_480._0_8_,local_470._M_allocated_capacity + 1);
      }
LAB_001117be:
      dumpPointerGraph((DGLLVMPointerAnalysis *)local_428,local_238);
    }
    else {
      if (dump_iteration.super_opt_storage<unsigned_long,_false,_false>.Value == 0) {
        dg::pta::PointerAnalysis::run();
      }
      else {
        (**(code **)(*(long *)local_3a8._M_t.
                              super__Tuple_impl<0UL,_dg::pta::PointerAnalysis_*,_std::default_delete<dg::pta::PointerAnalysis>_>
                              .super__Head_base<0UL,_dg::pta::PointerAnalysis_*,_false>._M_head_impl
                    + 0x30))
                  (local_3a8._M_t.
                   super__Tuple_impl<0UL,_dg::pta::PointerAnalysis_*,_std::default_delete<dg::pta::PointerAnalysis>_>
                   .super__Head_base<0UL,_dg::pta::PointerAnalysis_*,_false>._M_head_impl);
        dg::pta::PointerAnalysis::initialize_queue
                  ((PointerAnalysis *)
                   this._M_t.
                   super__Tuple_impl<0UL,_dg::pta::PointerAnalysis_*,_std::default_delete<dg::pta::PointerAnalysis>_>
                   .super__Head_base<0UL,_dg::pta::PointerAnalysis_*,_false>._M_head_impl);
        if (dump_iteration.super_opt_storage<unsigned_long,_false,_false>.Value != 0) {
          uVar12 = 1;
          do {
            bVar15 = dg::pta::PointerAnalysis::iteration
                               ((PointerAnalysis *)
                                this._M_t.
                                super__Tuple_impl<0UL,_dg::pta::PointerAnalysis_*,_std::default_delete<dg::pta::PointerAnalysis>_>
                                .super__Head_base<0UL,_dg::pta::PointerAnalysis_*,_false>.
                                _M_head_impl);
            if (!bVar15) break;
            dg::pta::PointerAnalysis::queue_changed
                      ((PointerAnalysis *)
                       this._M_t.
                       super__Tuple_impl<0UL,_dg::pta::PointerAnalysis_*,_std::default_delete<dg::pta::PointerAnalysis>_>
                       .super__Head_base<0UL,_dg::pta::PointerAnalysis_*,_false>._M_head_impl);
            bVar15 = uVar12 < dump_iteration.super_opt_storage<unsigned_long,_false,_false>.Value;
            uVar12 = (ulong)((int)uVar12 + 1);
          } while (bVar15);
        }
      }
      local_398.e.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      local_480._0_8_ = (Function *)(local_480 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_480,"INFO: Pointer analysis took","");
      dg::debug::TimeMeasure::report(&local_398,(string *)local_480,(ostream *)&std::cerr);
      if ((Function *)local_480._0_8_ != (Function *)(local_480 + 0x10)) {
        operator_delete((void *)local_480._0_8_,local_470._M_allocated_capacity + 1);
      }
      if (_stats[0x80] == '\x01') {
        dumpStats((DGLLVMPointerAnalysis *)local_428);
      }
      if (_quiet[0x80] == '\0') goto LAB_001117be;
    }
    local_428._0_8_ = &PTR_hasPointsTo_001227b8;
    std::
    unique_ptr<dg::pta::LLVMPointerGraphBuilder,_std::default_delete<dg::pta::LLVMPointerGraphBuilder>_>
    ::~unique_ptr(&local_3a0);
    if (local_3a8._M_t.
        super__Tuple_impl<0UL,_dg::pta::PointerAnalysis_*,_std::default_delete<dg::pta::PointerAnalysis>_>
        .super__Head_base<0UL,_dg::pta::PointerAnalysis_*,_false>._M_head_impl !=
        (_Tuple_impl<0UL,_dg::pta::PointerAnalysis_*,_std::default_delete<dg::pta::PointerAnalysis>_>
         )0x0) {
      (**(code **)(*(long *)local_3a8._M_t.
                            super__Tuple_impl<0UL,_dg::pta::PointerAnalysis_*,_std::default_delete<dg::pta::PointerAnalysis>_>
                            .super__Head_base<0UL,_dg::pta::PointerAnalysis_*,_false>._M_head_impl +
                  8))();
    }
    local_3a8._M_t.
    super__Tuple_impl<0UL,_dg::pta::PointerAnalysis_*,_std::default_delete<dg::pta::PointerAnalysis>_>
    .super__Head_base<0UL,_dg::pta::PointerAnalysis_*,_false>._M_head_impl =
         (tuple<dg::pta::PointerAnalysis_*,_std::default_delete<dg::pta::PointerAnalysis>_>)
         (_Tuple_impl<0UL,_dg::pta::PointerAnalysis_*,_std::default_delete<dg::pta::PointerAnalysis>_>
          )0x0;
    dg::LLVMPointerAnalysis::~LLVMPointerAnalysis((LLVMPointerAnalysis *)local_428);
  }
  iVar3 = 0;
LAB_00111813:
  std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::~unique_ptr
            ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)&local_498);
  llvm::LLVMContext::~LLVMContext((LLVMContext *)local_430);
  SlicerOptions::~SlicerOptions((SlicerOptions *)(local_2a8 + 8));
  return iVar3;
}

Assistant:

int main(int argc, char *argv[]) {
    setupStackTraceOnError(argc, argv);
    SlicerOptions options = parseSlicerOptions(argc, argv);

    if (enable_debug) {
        DBG_ENABLE();
    }

    if (verbose_more) {
        verbose = true;
    }
    if (callgraph_only) {
        callgraph = true;
    }

    llvm::LLVMContext context;
    std::unique_ptr<llvm::Module> M =
            parseModule("llvm-pta-dump", context, options);
    if (!M)
        return 1;

    if (!display_only.empty()) {
        for (const auto &func : splitList(display_only)) {
            auto *llvmFunc = M->getFunction(func);
            if (!llvmFunc) {
                llvm::errs() << "Invalid function to display: " << func
                             << ". Function not found in the module\n";
                return 1;
            }
            display_only_func.push_back(llvmFunc);
        }
    }

    TimeMeasure tm;
    auto &opts = options.dgOptions.PTAOptions;

#ifdef HAVE_SVF
    if (opts.isSVF()) {
        assert(dump_iteration == 0 && "SVF does not support -iteration");
        assert(!dump_graph_only && "SVF does not support -dump_graph_only");
        assert(!dump_graph_only && "SVF does not support -statistics yet");
    }
#endif

    if (!dump_ir) {
        std::unique_ptr<LLVMPointerAnalysis> llvmpta;

#ifdef HAVE_SVF
        if (opts.isSVF())
            llvmpta.reset(new SVFPointerAnalysis(M.get(), opts));
        else
#endif
            llvmpta.reset(new DGLLVMPointerAnalysis(M.get(), opts));

        tm.start();
        llvmpta->run();
        tm.stop();
        tm.report("INFO: Pointer analysis took");

        if (_stats) {
            if (opts.isSVF()) {
                llvm::errs() << "SVF analysis does not support stats dumping\n";
            } else {
                dumpStats(static_cast<DGLLVMPointerAnalysis *>(llvmpta.get()));
            }
            return 0;
        }

        if (_quiet) {
            return 0;
        }

        if (dump_c_lines) {
#if (LLVM_VERSION_MAJOR == 3 && LLVM_VERSION_MINOR < 7)
            llvm::errs() << "WARNING: Variables names matching is not "
                            "supported for LLVM older than 3.7\n";
#else
            valuesToVars = allocasToVars(*M);
#endif // LLVM > 3.6
            if (valuesToVars.empty()) {
                llvm::errs() << "WARNING: No debugging information found, "
                             << "the C lines output will be corrupted\n";
            }
        }

        for (auto &F : *M) {
            if (!display_only_func.empty() &&
                std::find(display_only_func.begin(), display_only_func.end(),
                          &F) == display_only_func.end()) {
                continue;
            }
            for (auto &B : F) {
                for (auto &I : B) {
                    if (!I.getType()->isPointerTy() &&
                        !I.getType()->isIntegerTy()) {
                        continue;
                    }

                    if (dump_c_lines && llvm::isa<llvm::AllocaInst>(&I)) {
                        // do not dump I->I for alloca, it makes no sense for C
                        continue;
                    }

                    auto pts = llvmpta->getLLVMPointsTo(&I);
                    if (pts.isUnknownSingleton()) {
                        // do not dump the "no-information"
                        continue;
                    }

                    std::cout << valToStr(&I) << "\n";
                    for (const auto &ptr : pts) {
                        std::cout << "  -> " << valToStr(ptr.value) << "\n";
                    }
                    if (pts.hasUnknown()) {
                        std::cout << "  -> unknown\n";
                    }
                    if (pts.hasNull()) {
                        std::cout << "  -> null\n";
                    }
                    if (pts.hasNullWithOffset()) {
                        std::cout << "  -> null + ?\n";
                    }
                    if (pts.hasInvalidated()) {
                        std::cout << "  -> invalidated\n";
                    }
                }
            }
        }
        return 0;
    }

    ///
    // Dumping the IR of pointer analysis
    //
    DGLLVMPointerAnalysis PTA(M.get(), opts);

    tm.start();

    PTA.initialize();

    if (dump_graph_only) {
        tm.stop();
        tm.report("INFO: Pointer analysis (building graph) took");
        dumpPointerGraph(&PTA, opts.analysisType);
        return 0;
    }

    auto *PA = PTA.getPTA();
    assert(PA && "Did not initialize the analysis");

    // run the analysis
    if (dump_iteration > 0) {
        // do preprocessing and queue the nodes
        PA->preprocess();
        PA->initialize_queue();

        // do fixpoint
        for (unsigned i = 0; i < dump_iteration; ++i) {
            if (!PA->iteration())
                break;
            PA->queue_changed();
        }
    } else {
        PA->run();
    }

    tm.stop();
    tm.report("INFO: Pointer analysis took");

    if (_stats) {
        dumpStats(&PTA);
    }

    if (_quiet)
        return 0;

    dumpPointerGraph(&PTA, opts.analysisType);

    return 0;
}